

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfOutputWritePixels(ImfOutputFile *out,int numScanLines)

{
  int in_ESI;
  RgbaOutputFile *in_RDI;
  exception *e;
  
  anon_unknown.dwarf_70604::outfile((ImfOutputFile *)in_RDI);
  Imf_3_4::RgbaOutputFile::writePixels(in_RDI,in_ESI);
  return 1;
}

Assistant:

int
ImfOutputWritePixels (ImfOutputFile* out, int numScanLines)
{
    try
    {
        outfile (out)->writePixels (numScanLines);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}